

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

void google::protobuf::CleanStringLineEndings(string *src,string *dst,bool auto_end_last_line)

{
  byte bVar1;
  string *in_RSI;
  string *in_RDI;
  string tmp;
  string local_38 [23];
  undefined1 in_stack_ffffffffffffffdf;
  string *in_stack_ffffffffffffffe0;
  
  bVar1 = std::__cxx11::string::empty();
  if ((bVar1 & 1) == 0) {
    std::__cxx11::string::string(local_38,in_RDI);
    CleanStringLineEndings(in_stack_ffffffffffffffe0,(bool)in_stack_ffffffffffffffdf);
    std::__cxx11::string::append(in_RSI);
    std::__cxx11::string::~string(local_38);
  }
  else {
    std::__cxx11::string::append(in_RSI);
    CleanStringLineEndings(in_stack_ffffffffffffffe0,(bool)in_stack_ffffffffffffffdf);
  }
  return;
}

Assistant:

void CleanStringLineEndings(const std::string &src, std::string *dst,
                            bool auto_end_last_line) {
  if (dst->empty()) {
    dst->append(src);
    CleanStringLineEndings(dst, auto_end_last_line);
  } else {
    std::string tmp = src;
    CleanStringLineEndings(&tmp, auto_end_last_line);
    dst->append(tmp);
  }
}